

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ShaderSharingTest::renderResource
          (GLES2ShaderSharingTest *this,Surface *screen,Surface *reference)

{
  glReadPixelsFunc p_Var1;
  Surface *this_00;
  GLenum GVar2;
  deBool dVar3;
  GLuint GVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  MessageBuilder *pMVar9;
  TestError *pTVar10;
  void *pvVar11;
  float *pfVar12;
  float s_00;
  float s_01;
  RGBA local_ff8;
  int local_ff4;
  int local_ff0;
  int alpha;
  int blue;
  int green;
  int red;
  Vector<float,_4> local_fd4;
  Vector<float,_4> local_fc4;
  Vector<float,_4> local_fb4;
  tcu local_fa4 [8];
  float local_f9c [2];
  Vector<float,_4> local_f94;
  Vector<float,_4> local_f84;
  Vector<float,_4> local_f74;
  Vector<float,_4> local_f64;
  tcu local_f54 [8];
  float local_f4c [2];
  undefined1 local_f44 [8];
  Vec4 color;
  Vec4 d;
  Vec4 c;
  Vec4 b;
  Vec4 a;
  bool isUpper;
  float s;
  float t;
  int y;
  int x;
  int y2;
  int y1;
  int x2;
  int x1;
  PixelBufferAccess local_ec0;
  PixelBufferAccess local_e98;
  GLuint local_e70;
  GLuint local_e6c;
  GLuint colorLocation;
  GLuint coordLocation;
  MessageBuilder local_ce8;
  MessageBuilder local_b68;
  MessageBuilder local_9e8;
  GLchar local_868 [8];
  char buffer_1 [256];
  undefined1 local_758 [4];
  GLuint program;
  MessageBuilder local_5d8;
  MessageBuilder local_458;
  MessageBuilder local_2c8;
  GLchar local_148 [8];
  char buffer [256];
  GLint local_40;
  GLuint local_3c;
  GLint status;
  GLuint otherShader;
  char *fragmentShader;
  char *vertexShader;
  int height;
  int width;
  Surface *reference_local;
  Surface *screen_local;
  GLES2ShaderSharingTest *this_local;
  
  vertexShader._4_4_ = 0xf0;
  vertexShader._0_4_ = 0xf0;
  fragmentShader =
       "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
  ;
  _status = "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}\n";
  local_3c = 0xffffffff;
  _height = reference;
  reference_local = screen;
  screen_local = (Surface *)this;
  if (this->m_shaderType == 0x8b30) {
    local_3c = (*(this->super_GLES2SharingTest).m_gl.createShader)(0x8b31);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"glCreateShader()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x391);
    do {
      (*(this->super_GLES2SharingTest).m_gl.shaderSource)(local_3c,1,&fragmentShader,(GLint *)0x0);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"shaderSource(otherShader, 1, &vertexShader, DE_NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x392);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  else if (this->m_shaderType == 0x8b31) {
    local_3c = (*(this->super_GLES2SharingTest).m_gl.createShader)(0x8b30);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"glCreateShader()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x38b);
    do {
      (*(this->super_GLES2SharingTest).m_gl.shaderSource)
                (local_3c,1,(GLchar **)&status,(GLint *)0x0);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"shaderSource(otherShader, 1, &fragmentShader, DE_NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x38c);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  do {
    (*(this->super_GLES2SharingTest).m_gl.compileShader)(local_3c);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"compileShader(otherShader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x399);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  local_40 = 0;
  do {
    (*(this->super_GLES2SharingTest).m_gl.getShaderiv)(local_3c,0x8b81,&local_40);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"getShaderiv(otherShader, GL_COMPILE_STATUS, &status)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x39c);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  if (local_40 != 0) {
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.createProgram)();
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"glCreateProgram()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3b8);
    do {
      (*(this->super_GLES2SharingTest).m_gl.attachShader)(GVar4,this->m_shader);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"attachShader(program, m_shader)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3ba);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      (*(this->super_GLES2SharingTest).m_gl.attachShader)(GVar4,local_3c);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"attachShader(program, otherShader)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3bb);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      (*(this->super_GLES2SharingTest).m_gl.linkProgram)(GVar4);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"linkProgram(program)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3bd);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      (*(this->super_GLES2SharingTest).m_gl.deleteShader)(local_3c);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"deleteShader(otherShader)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3be);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    local_40 = 0;
    do {
      (*(this->super_GLES2SharingTest).m_gl.getProgramiv)(GVar4,0x8b82,&local_40);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"getProgramiv(program, GL_LINK_STATUS, &status)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3c1);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    if (local_40 != 0) {
      if (reference_local != (Surface *)0x0) {
        vertexShader._4_4_ = tcu::Surface::getWidth(reference_local);
        vertexShader._0_4_ = tcu::Surface::getHeight(reference_local);
      }
      do {
        (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,vertexShader._4_4_,(int)vertexShader);
        GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
        glu::checkError(GVar2,"viewport(0, 0, width, height)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                        ,0x3e9);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      do {
        (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
        GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
        glu::checkError(GVar2,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                        ,0x3eb);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      do {
        (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
        GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
        glu::checkError(GVar2,"clear(GL_COLOR_BUFFER_BIT)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                        ,0x3ec);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      do {
        (*(this->super_GLES2SharingTest).m_gl.useProgram)(GVar4);
        GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
        glu::checkError(GVar2,"useProgram(program)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                        ,0x3ee);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      local_e6c = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)(GVar4,"a_pos");
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"glGetAttribLocation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3f1);
      while ((dVar3 = ::deGetFalse(), dVar3 == 0 && (local_e6c != 0xffffffff))) {
        dVar3 = ::deGetFalse();
        if (dVar3 == 0) {
          local_e70 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)(GVar4,"a_color");
          GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar2,"glGetAttribLocation()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3f5);
          while ((dVar3 = ::deGetFalse(), dVar3 == 0 && (local_e70 != 0xffffffff))) {
            dVar3 = ::deGetFalse();
            if (dVar3 == 0) {
              do {
                (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(local_e70);
                GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar2,"enableVertexAttribArray(colorLocation)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x3f8);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(local_e6c);
                GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar2,"enableVertexAttribArray(coordLocation)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x3f9);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                          (local_e70,4,0x1406,'\0',0,renderResource::colors);
                GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar2,
                                "vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x3fb);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                          (local_e6c,2,0x1406,'\0',0,renderResource::coords);
                GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar2,
                                "vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x3fc);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.drawElements)
                          (4,6,0x1403,renderResource::indices);
                GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar2,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x3fe);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(local_e6c);
                GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar2,"disableVertexAttribArray(coordLocation)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x3ff);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(local_e70);
                GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar2,"disableVertexAttribArray(colorLocation)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x400);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
                GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar2,"useProgram(0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x401);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              if (reference_local != (Surface *)0x0) {
                p_Var1 = (this->super_GLES2SharingTest).m_gl.readPixels;
                iVar5 = tcu::Surface::getWidth(reference_local);
                iVar6 = tcu::Surface::getHeight(reference_local);
                tcu::Surface::getAccess(&local_e98,reference_local);
                pvVar11 = tcu::PixelBufferAccess::getDataPtr(&local_e98);
                (*p_Var1)(0,0,iVar5,iVar6,0x1908,0x1401,pvVar11);
                tcu::Surface::getAccess(&local_ec0,_height);
                tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&x2,0xff,0,0,0xff);
                tcu::clear(&local_ec0,(IVec4 *)&x2);
                iVar5 = (int)(((float)vertexShader._4_4_ / 2.0) * 0.9 +
                             (float)vertexShader._4_4_ / 2.0);
                fVar8 = (float)(int)(((float)(int)vertexShader / 2.0) * -0.9 +
                                    (float)(int)vertexShader / 2.0);
                iVar6 = (int)(((float)(int)vertexShader / 2.0) * 0.9 +
                             (float)(int)vertexShader / 2.0);
                fVar7 = (float)(int)(((float)vertexShader._4_4_ / 2.0) * -0.9 +
                                    (float)vertexShader._4_4_ / 2.0);
                for (t = fVar7; s = fVar8, (int)t <= iVar5; t = (float)((int)t + 1)) {
                  for (; (int)s <= iVar6; s = (float)((int)s + 1)) {
                    s_00 = (float)((int)t - (int)fVar7) / (float)(iVar5 - (int)fVar7);
                    s_01 = (float)((int)s - (int)fVar8) / (float)(iVar6 - (int)fVar8);
                    tcu::Vector<float,_4>::Vector
                              ((Vector<float,_4> *)(b.m_data + 2),0.0,0.0,0.0,1.0);
                    tcu::Vector<float,_4>::Vector
                              ((Vector<float,_4> *)(c.m_data + 2),1.0,0.0,0.0,1.0);
                    tcu::Vector<float,_4>::Vector
                              ((Vector<float,_4> *)(d.m_data + 2),0.0,1.0,0.0,1.0);
                    tcu::Vector<float,_4>::Vector
                              ((Vector<float,_4> *)(color.m_data + 2),0.0,0.0,1.0,1.0);
                    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_f44);
                    if (s_00 <= s_01) {
                      tcu::operator*((tcu *)&local_fc4,(Vector<float,_4> *)(b.m_data + 2),1.0 - s_01
                                    );
                      tcu::operator*((tcu *)&local_fd4,(Vector<float,_4> *)(color.m_data + 2),
                                     s_01 - s_00);
                      tcu::operator+((tcu *)&local_fb4,&local_fc4,&local_fd4);
                      tcu::operator*((tcu *)&green,s_00,(Vector<float,_4> *)(d.m_data + 2));
                      tcu::operator+(local_fa4,&local_fb4,(Vector<float,_4> *)&green);
                      local_f44[0] = local_fa4[0];
                      local_f44[1] = local_fa4[1];
                      local_f44[2] = local_fa4[2];
                      local_f44[3] = local_fa4[3];
                      local_f44[4] = local_fa4[4];
                      local_f44[5] = local_fa4[5];
                      local_f44[6] = local_fa4[6];
                      local_f44[7] = local_fa4[7];
                      color.m_data[0] = local_f9c[0];
                      color.m_data[1] = local_f9c[1];
                    }
                    else {
                      tcu::operator*((tcu *)&local_f74,(Vector<float,_4> *)(b.m_data + 2),1.0 - s_00
                                    );
                      tcu::operator*((tcu *)&local_f84,(Vector<float,_4> *)(c.m_data + 2),
                                     s_00 - s_01);
                      tcu::operator+((tcu *)&local_f64,&local_f74,&local_f84);
                      tcu::operator*((tcu *)&local_f94,s_01,(Vector<float,_4> *)(d.m_data + 2));
                      tcu::operator+(local_f54,&local_f64,&local_f94);
                      local_f44[0] = local_f54[0];
                      local_f44[1] = local_f54[1];
                      local_f44[2] = local_f54[2];
                      local_f44[3] = local_f54[3];
                      local_f44[4] = local_f54[4];
                      local_f44[5] = local_f54[5];
                      local_f44[6] = local_f54[6];
                      local_f44[7] = local_f54[7];
                      color.m_data[0] = local_f4c[0];
                      color.m_data[1] = local_f4c[1];
                    }
                    pfVar12 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_f44);
                    blue = deClamp32((int)(*pfVar12 * 255.0),0,0xff);
                    pfVar12 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_f44);
                    alpha = deClamp32((int)(*pfVar12 * 255.0),0,0xff);
                    pfVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_f44);
                    local_ff0 = deClamp32((int)(*pfVar12 * 255.0),0,0xff);
                    pfVar12 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_f44);
                    local_ff4 = deClamp32((int)(*pfVar12 * 255.0),0,0xff);
                    this_00 = _height;
                    tcu::RGBA::RGBA(&local_ff8,blue,alpha,local_ff0,local_ff4);
                    tcu::Surface::setPixel(this_00,(int)t,(int)s,local_ff8);
                  }
                }
              }
              return;
            }
          }
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,(char *)0x0,"colorLocation != (GLuint)-1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                     ,0x3f6);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,(char *)0x0,"coordLocation != (GLuint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                 ,0x3f2);
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    do {
      (*(this->super_GLES2SharingTest).m_gl.getProgramInfoLog)(GVar4,0x100,(GLsizei *)0x0,local_868)
      ;
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"getProgramInfoLog(program, 256, DE_NULL, buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3c6);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    tcu::TestLog::operator<<
              (&local_9e8,(this->super_GLES2SharingTest).m_log,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_9e8,(char (*) [23])"Failed to link program");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_9e8);
    tcu::TestLog::operator<<
              (&local_b68,(this->super_GLES2SharingTest).m_log,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_b68,&fragmentShader);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_b68);
    tcu::TestLog::operator<<
              (&local_ce8,(this->super_GLES2SharingTest).m_log,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_ce8,(char **)&status);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_ce8);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&colorLocation,(this->super_GLES2SharingTest).m_log,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&colorLocation,(char (*) [256])local_868);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&colorLocation);
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Failed to link program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x3cd);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  do {
    (*(this->super_GLES2SharingTest).m_gl.getShaderInfoLog)(local_3c,0x100,(GLsizei *)0x0,local_148)
    ;
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"getShaderInfoLog(otherShader, 256, DE_NULL, buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3a1);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::TestLog::operator<<
            (&local_2c8,(this->super_GLES2SharingTest).m_log,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_2c8,(char (*) [25])"Failed to compile shader");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2c8);
  if (this->m_shaderType == 0x8b30) {
    tcu::TestLog::operator<<
              (&local_458,(this->super_GLES2SharingTest).m_log,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_458,&fragmentShader);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_458);
  }
  else if (this->m_shaderType == 0x8b31) {
    tcu::TestLog::operator<<
              (&local_5d8,(this->super_GLES2SharingTest).m_log,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_5d8,(char **)&status);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5d8);
  }
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_758,(this->super_GLES2SharingTest).m_log,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_758,(char (*) [256])local_148);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_758);
  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar10,"Failed to compile shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x3b4);
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GLES2ShaderSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	int width = 240;
	int height = 240;

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec4 a_color;\n"
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = v_color;\n"
	"}\n";


	GLuint otherShader = (GLuint)-1;

	switch (m_shaderType)
	{
		case GL_VERTEX_SHADER:
			otherShader = m_gl.createShader(GL_FRAGMENT_SHADER);
			GLU_CHECK_GLW_MSG(m_gl, "glCreateShader()");
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(otherShader, 1, &fragmentShader, DE_NULL));
			break;

		case GL_FRAGMENT_SHADER:
			otherShader = m_gl.createShader(GL_VERTEX_SHADER);
			GLU_CHECK_GLW_MSG(m_gl, "glCreateShader()");
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(otherShader, 1, &vertexShader, DE_NULL));
			break;

		default:
			DE_ASSERT(false);
	}

	GLU_CHECK_GLW_CALL(m_gl, compileShader(otherShader));

	GLint status = 0;
	GLU_CHECK_GLW_CALL(m_gl, getShaderiv(otherShader, GL_COMPILE_STATUS, &status));

	if (!status)
	{
		char buffer[256];
		GLU_CHECK_GLW_CALL(m_gl, getShaderInfoLog(otherShader, 256, DE_NULL, buffer));

		m_log << tcu::TestLog::Message << "Failed to compile shader" << tcu::TestLog::EndMessage;

		switch (m_shaderType)
		{
			case GL_FRAGMENT_SHADER:
				m_log << tcu::TestLog::Message << vertexShader << tcu::TestLog::EndMessage;
				break;

			case GL_VERTEX_SHADER:
				m_log << tcu::TestLog::Message << fragmentShader << tcu::TestLog::EndMessage;
				break;

			default:
				DE_ASSERT(false);
		}

		m_log << tcu::TestLog::Message << buffer << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to compile shader");
	}

	GLuint program = m_gl.createProgram();
	GLU_CHECK_GLW_MSG(m_gl, "glCreateProgram()");

	GLU_CHECK_GLW_CALL(m_gl, attachShader(program, m_shader));
	GLU_CHECK_GLW_CALL(m_gl, attachShader(program, otherShader));

	GLU_CHECK_GLW_CALL(m_gl, linkProgram(program));
	GLU_CHECK_GLW_CALL(m_gl, deleteShader(otherShader));

	status = 0;
	GLU_CHECK_GLW_CALL(m_gl, getProgramiv(program, GL_LINK_STATUS, &status));

	if (!status)
	{
		char buffer[256];
		GLU_CHECK_GLW_CALL(m_gl, getProgramInfoLog(program, 256, DE_NULL, buffer));

		m_log << tcu::TestLog::Message << "Failed to link program" << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << vertexShader << tcu::TestLog::EndMessage;
		m_log << tcu::TestLog::Message << fragmentShader << tcu::TestLog::EndMessage;
		m_log << tcu::TestLog::Message << buffer << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to link program");
	}

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-0.9f, -0.9f,
		 0.9f, -0.9f,
		 0.9f,  0.9f,
		-0.9f,  0.9f
	};

	static const GLfloat colors [] = {
		0.0f, 0.0f, 0.0f, 1.0f,
		1.0f, 0.0f, 0.0f, 1.0f,
		0.0f, 1.0f, 0.0f, 1.0f,
		0.0f, 0.0f, 1.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program));

	GLuint coordLocation = m_gl.getAttribLocation(program, "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(program, "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));

		int x1 = (int)(((float)width/2.0f)  * (-0.9f) + ((float)width/2.0f));
		int x2 = (int)(((float)width/2.0f)  *   0.9f  + ((float)width/2.0f));
		int y1 = (int)(((float)height/2.0f) * (-0.9f) + ((float)height/2.0f));
		int y2 = (int)(((float)height/2.0f) *   0.9f  + ((float)height/2.0f));

		for (int x = x1; x <= x2; x++)
		{
			for (int y = y1; y <= y2; y++)
			{
				float t = ((float)(x-x1) / (float)(x2-x1));
				float s = ((float)(y-y1) / (float)(y2-y1));
				bool isUpper = t > s;

				tcu::Vec4 a(colors[0],		colors[1],		colors[2],		colors[3]);
				tcu::Vec4 b(colors[4 + 0],	colors[4 + 1],	colors[4 + 2],	colors[4 + 3]);
				tcu::Vec4 c(colors[8 + 0],	colors[8 + 1],	colors[8 + 2],	colors[8 + 3]);
				tcu::Vec4 d(colors[12 + 0],	colors[12 + 1],	colors[12 + 2],	colors[12 + 3]);


				tcu::Vec4 color;

				if (isUpper)
					color = a * (1.0f - t)  + b * (t - s) + s * c;
				else
					color = a * (1.0f - s)  + d * (s - t) + t * c;

				int red		= deClamp32((int)(255.0f * color.x()), 0, 255);
				int green	= deClamp32((int)(255.0f * color.y()), 0, 255);
				int blue	= deClamp32((int)(255.0f * color.z()), 0, 255);
				int alpha	= deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(red, green, blue, alpha));
			}
		}
	}
}